

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  ushort uVar19;
  undefined1 auVar20 [15];
  ushort uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [13];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [16];
  long lVar44;
  int iVar45;
  short sVar48;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar58 [16];
  short sVar59;
  short sVar62;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar71;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  short sVar81;
  undefined1 auVar74 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  short sVar97;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  undefined1 auVar98 [16];
  short sVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  short sVar64;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  
  auVar46 = *(undefined1 (*) [16])above;
  auVar60 = *(undefined1 (*) [16])(above + 0x10);
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar46._0_13_;
  auVar18[0xe] = auVar46[7];
  uVar21 = auVar18._13_2_;
  auVar22[0xc] = auVar46[6];
  auVar22._0_12_ = auVar46._0_12_;
  auVar22._13_2_ = uVar21;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar46._0_11_;
  auVar24._12_3_ = auVar22._12_3_;
  auVar26[10] = auVar46[5];
  auVar26._0_10_ = auVar46._0_10_;
  auVar26._11_4_ = auVar24._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar46._0_9_;
  auVar28._10_5_ = auVar26._10_5_;
  auVar30[8] = auVar46[4];
  auVar30._0_8_ = auVar46._0_8_;
  auVar30._9_6_ = auVar28._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar30._8_7_;
  Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),auVar46[3]);
  auVar39._9_6_ = 0;
  auVar39._0_9_ = Var33;
  auVar34._1_10_ = SUB1510(auVar39 << 0x30,5);
  auVar34[0] = auVar46[2];
  auVar40._11_4_ = 0;
  auVar40._0_11_ = auVar34;
  auVar35._1_12_ = SUB1512(auVar40 << 0x20,3);
  auVar35[0] = auVar46[1];
  auVar57._0_2_ = CONCAT11(0,auVar46[0]);
  auVar57._2_13_ = auVar35;
  auVar57[0xf] = 0;
  auVar82._0_2_ = CONCAT11(0,auVar46[8]);
  bVar87 = auVar46[9];
  auVar82[2] = bVar87;
  auVar82[3] = 0;
  bVar88 = auVar46[10];
  auVar82[4] = bVar88;
  auVar82[5] = 0;
  bVar89 = auVar46[0xb];
  auVar82[6] = bVar89;
  auVar82[7] = 0;
  bVar90 = auVar46[0xc];
  auVar82[8] = bVar90;
  auVar82[9] = 0;
  bVar91 = auVar46[0xd];
  auVar82[10] = bVar91;
  auVar82[0xb] = 0;
  bVar92 = auVar46[0xe];
  auVar82[0xc] = bVar92;
  auVar82[0xd] = 0;
  bVar93 = auVar46[0xf];
  auVar82[0xe] = bVar93;
  auVar82[0xf] = 0;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar60._0_13_;
  auVar17[0xe] = auVar60[7];
  uVar19 = auVar17._13_2_;
  auVar20[0xc] = auVar60[6];
  auVar20._0_12_ = auVar60._0_12_;
  auVar20._13_2_ = uVar19;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar60._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar25[10] = auVar60[5];
  auVar25._0_10_ = auVar60._0_10_;
  auVar25._11_4_ = auVar23._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar60._0_9_;
  auVar27._10_5_ = auVar25._10_5_;
  auVar29[8] = auVar60[4];
  auVar29._0_8_ = auVar60._0_8_;
  auVar29._9_6_ = auVar27._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar29._8_7_;
  Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar60[3]);
  auVar41._9_6_ = 0;
  auVar41._0_9_ = Var37;
  auVar38._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar38[0] = auVar60[2];
  auVar42._11_4_ = 0;
  auVar42._0_11_ = auVar38;
  auVar31[2] = auVar60[1];
  auVar31._0_2_ = auVar60._0_2_;
  auVar31._3_12_ = SUB1512(auVar42 << 0x20,3);
  auVar46._0_2_ = auVar60._0_2_ & 0xff;
  auVar46._2_13_ = auVar31._2_13_;
  auVar46[0xf] = 0;
  auVar49._0_2_ = CONCAT11(0,auVar60[8]);
  bVar50 = auVar60[9];
  auVar49[2] = bVar50;
  auVar49[3] = 0;
  bVar51 = auVar60[10];
  auVar49[4] = bVar51;
  auVar49[5] = 0;
  bVar52 = auVar60[0xb];
  auVar49[6] = bVar52;
  auVar49[7] = 0;
  bVar53 = auVar60[0xc];
  auVar49[8] = bVar53;
  auVar49[9] = 0;
  bVar54 = auVar60[0xd];
  auVar49[10] = bVar54;
  auVar49[0xb] = 0;
  bVar55 = auVar60[0xe];
  auVar49[0xc] = bVar55;
  auVar49[0xd] = 0;
  bVar56 = auVar60[0xf];
  auVar49[0xe] = bVar56;
  auVar49[0xf] = 0;
  auVar60 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar61._0_4_ = auVar60._0_4_;
  auVar61._4_4_ = auVar61._0_4_;
  auVar61._8_4_ = auVar61._0_4_;
  auVar61._12_4_ = auVar61._0_4_;
  sVar59 = auVar60._0_2_;
  auVar63._0_2_ = auVar57._0_2_ - sVar59;
  sVar62 = auVar60._2_2_;
  auVar63._2_2_ = auVar35._0_2_ - sVar62;
  auVar63._4_2_ = auVar34._0_2_ - sVar59;
  sVar64 = (short)Var33;
  auVar63._6_2_ = sVar64 - sVar62;
  auVar63._8_2_ = auVar30._8_2_ - sVar59;
  auVar63._10_2_ = auVar26._10_2_ - sVar62;
  auVar63._12_2_ = auVar22._12_2_ - sVar59;
  auVar63._14_2_ = (uVar21 >> 8) - sVar62;
  auVar58 = pabsw(in_XMM3,auVar63);
  auVar60._0_2_ = auVar46._0_2_ - sVar59;
  auVar60._2_2_ = auVar31._2_2_ - sVar62;
  auVar60._4_2_ = auVar38._0_2_ - sVar59;
  sVar48 = (short)Var37;
  auVar60._6_2_ = sVar48 - sVar62;
  auVar60._8_2_ = auVar29._8_2_ - sVar59;
  auVar60._10_2_ = auVar25._10_2_ - sVar62;
  auVar60._12_2_ = auVar20._12_2_ - sVar59;
  auVar60._14_2_ = (uVar19 >> 8) - sVar62;
  auVar47 = pabsw(auVar60,auVar60);
  lVar44 = 0;
  auVar65._0_2_ = auVar82._0_2_ - sVar59;
  auVar65._2_2_ = (ushort)bVar87 - sVar62;
  auVar65._4_2_ = (ushort)bVar88 - sVar59;
  auVar65._6_2_ = (ushort)bVar89 - sVar62;
  auVar65._8_2_ = (ushort)bVar90 - sVar59;
  auVar65._10_2_ = (ushort)bVar91 - sVar62;
  auVar65._12_2_ = (ushort)bVar92 - sVar59;
  auVar65._14_2_ = (ushort)bVar93 - sVar62;
  auVar65 = pabsw(in_XMM6,auVar65);
  do {
    auVar43 = *(undefined1 (*) [16])(left + lVar44 * 0x10);
    iVar45 = 0x10;
    auVar106 = _DAT_004dcf60;
    do {
      auVar98 = pshufb(auVar43,auVar106);
      sVar97 = auVar98._0_2_;
      sVar99 = auVar98._2_2_;
      sVar100 = auVar98._4_2_;
      sVar101 = auVar98._6_2_;
      sVar102 = auVar98._8_2_;
      sVar103 = auVar98._10_2_;
      sVar104 = auVar98._12_2_;
      sVar105 = auVar98._14_2_;
      auVar95._0_2_ = (auVar63._0_2_ + sVar97) - auVar57._0_2_;
      auVar95._2_2_ = (auVar63._2_2_ + sVar99) - auVar35._0_2_;
      auVar95._4_2_ = (auVar63._4_2_ + sVar100) - auVar34._0_2_;
      auVar95._6_2_ = (auVar63._6_2_ + sVar101) - sVar64;
      auVar95._8_2_ = (auVar63._8_2_ + sVar102) - auVar30._8_2_;
      auVar95._10_2_ = (auVar63._10_2_ + sVar103) - auVar26._10_2_;
      auVar95._12_2_ = (auVar63._12_2_ + sVar104) - auVar22._12_2_;
      auVar95._14_2_ = (auVar63._14_2_ + sVar105) - (uVar21 >> 8);
      auVar68 = pabsw(auVar95,auVar95);
      auVar66._0_2_ = (auVar63._0_2_ + sVar97) - sVar59;
      auVar66._2_2_ = (auVar63._2_2_ + sVar99) - sVar62;
      auVar66._4_2_ = (auVar63._4_2_ + sVar100) - sVar59;
      auVar66._6_2_ = (auVar63._6_2_ + sVar101) - sVar62;
      auVar66._8_2_ = (auVar63._8_2_ + sVar102) - sVar59;
      auVar66._10_2_ = (auVar63._10_2_ + sVar103) - sVar62;
      auVar66._12_2_ = (auVar63._12_2_ + sVar104) - sVar59;
      auVar66._14_2_ = (auVar63._14_2_ + sVar105) - sVar62;
      auVar66 = pabsw(auVar66,auVar66);
      auVar72._0_2_ = -(ushort)(auVar68._0_2_ < auVar58._0_2_);
      auVar72._2_2_ = -(ushort)(auVar68._2_2_ < auVar58._2_2_);
      auVar72._4_2_ = -(ushort)(auVar68._4_2_ < auVar58._4_2_);
      auVar72._6_2_ = -(ushort)(auVar68._6_2_ < auVar58._6_2_);
      auVar72._8_2_ = -(ushort)(auVar68._8_2_ < auVar58._8_2_);
      auVar72._10_2_ = -(ushort)(auVar68._10_2_ < auVar58._10_2_);
      auVar72._12_2_ = -(ushort)(auVar68._12_2_ < auVar58._12_2_);
      auVar72._14_2_ = -(ushort)(auVar68._14_2_ < auVar58._14_2_);
      auVar110._0_2_ = -(ushort)(auVar66._0_2_ < auVar58._0_2_);
      auVar110._2_2_ = -(ushort)(auVar66._2_2_ < auVar58._2_2_);
      auVar110._4_2_ = -(ushort)(auVar66._4_2_ < auVar58._4_2_);
      auVar110._6_2_ = -(ushort)(auVar66._6_2_ < auVar58._6_2_);
      auVar110._8_2_ = -(ushort)(auVar66._8_2_ < auVar58._8_2_);
      auVar110._10_2_ = -(ushort)(auVar66._10_2_ < auVar58._10_2_);
      auVar110._12_2_ = -(ushort)(auVar66._12_2_ < auVar58._12_2_);
      auVar110._14_2_ = -(ushort)(auVar66._14_2_ < auVar58._14_2_);
      auVar111._0_2_ = -(ushort)(auVar66._0_2_ < auVar68._0_2_);
      auVar111._2_2_ = -(ushort)(auVar66._2_2_ < auVar68._2_2_);
      auVar111._4_2_ = -(ushort)(auVar66._4_2_ < auVar68._4_2_);
      auVar111._6_2_ = -(ushort)(auVar66._6_2_ < auVar68._6_2_);
      auVar111._8_2_ = -(ushort)(auVar66._8_2_ < auVar68._8_2_);
      auVar111._10_2_ = -(ushort)(auVar66._10_2_ < auVar68._10_2_);
      auVar111._12_2_ = -(ushort)(auVar66._12_2_ < auVar68._12_2_);
      auVar111._14_2_ = -(ushort)(auVar66._14_2_ < auVar68._14_2_);
      auVar107._0_2_ = sVar97 - sVar59;
      auVar107._2_2_ = sVar99 - sVar62;
      auVar107._4_2_ = sVar100 - sVar59;
      auVar107._6_2_ = sVar101 - sVar62;
      auVar107._8_2_ = sVar102 - sVar59;
      auVar107._10_2_ = sVar103 - sVar62;
      auVar107._12_2_ = sVar104 - sVar59;
      auVar107._14_2_ = sVar105 - sVar62;
      auVar73 = pabsw(auVar72,auVar107);
      auVar68._0_2_ = (auVar107._0_2_ + auVar82._0_2_) - sVar59;
      auVar68._2_2_ = (auVar107._2_2_ + (ushort)bVar87) - sVar62;
      auVar68._4_2_ = (auVar107._4_2_ + (ushort)bVar88) - sVar59;
      auVar68._6_2_ = (auVar107._6_2_ + (ushort)bVar89) - sVar62;
      auVar68._8_2_ = (auVar107._8_2_ + (ushort)bVar90) - sVar59;
      auVar68._10_2_ = (auVar107._10_2_ + (ushort)bVar91) - sVar62;
      auVar68._12_2_ = (auVar107._12_2_ + (ushort)bVar92) - sVar59;
      auVar68._14_2_ = (auVar107._14_2_ + (ushort)bVar93) - sVar62;
      auVar66 = pabsw(auVar68,auVar68);
      sVar71 = auVar73._0_2_;
      auVar83._0_2_ = -(ushort)(sVar71 < auVar65._0_2_);
      sVar75 = auVar73._2_2_;
      auVar83._2_2_ = -(ushort)(sVar75 < auVar65._2_2_);
      sVar76 = auVar73._4_2_;
      auVar83._4_2_ = -(ushort)(sVar76 < auVar65._4_2_);
      sVar77 = auVar73._6_2_;
      auVar83._6_2_ = -(ushort)(sVar77 < auVar65._6_2_);
      sVar78 = auVar73._8_2_;
      auVar83._8_2_ = -(ushort)(sVar78 < auVar65._8_2_);
      sVar79 = auVar73._10_2_;
      auVar83._10_2_ = -(ushort)(sVar79 < auVar65._10_2_);
      sVar80 = auVar73._12_2_;
      auVar83._12_2_ = -(ushort)(sVar80 < auVar65._12_2_);
      sVar81 = auVar73._14_2_;
      auVar83._14_2_ = -(ushort)(sVar81 < auVar65._14_2_);
      auVar94._0_2_ = -(ushort)(auVar66._0_2_ < auVar65._0_2_);
      auVar94._2_2_ = -(ushort)(auVar66._2_2_ < auVar65._2_2_);
      auVar94._4_2_ = -(ushort)(auVar66._4_2_ < auVar65._4_2_);
      auVar94._6_2_ = -(ushort)(auVar66._6_2_ < auVar65._6_2_);
      auVar94._8_2_ = -(ushort)(auVar66._8_2_ < auVar65._8_2_);
      auVar94._10_2_ = -(ushort)(auVar66._10_2_ < auVar65._10_2_);
      auVar94._12_2_ = -(ushort)(auVar66._12_2_ < auVar65._12_2_);
      auVar94._14_2_ = -(ushort)(auVar66._14_2_ < auVar65._14_2_);
      auVar84._0_2_ = -(ushort)(auVar66._0_2_ < sVar71);
      auVar84._2_2_ = -(ushort)(auVar66._2_2_ < sVar75);
      auVar84._4_2_ = -(ushort)(auVar66._4_2_ < sVar76);
      auVar84._6_2_ = -(ushort)(auVar66._6_2_ < sVar77);
      auVar84._8_2_ = -(ushort)(auVar66._8_2_ < sVar78);
      auVar84._10_2_ = -(ushort)(auVar66._10_2_ < sVar79);
      auVar84._12_2_ = -(ushort)(auVar66._12_2_ < sVar80);
      auVar84._14_2_ = -(ushort)(auVar66._14_2_ < sVar81);
      auVar111 = ~(auVar110 | auVar72) & auVar98 |
                 (~auVar111 & auVar57 | auVar61 & auVar111) & (auVar110 | auVar72);
      auVar68 = (~auVar84 & auVar82 | auVar61 & auVar84) & (auVar94 | auVar83);
      auVar95 = ~(auVar94 | auVar83) & auVar98 | auVar68;
      sVar1 = auVar111._0_2_;
      sVar2 = auVar111._2_2_;
      sVar3 = auVar111._4_2_;
      sVar4 = auVar111._6_2_;
      sVar5 = auVar111._8_2_;
      sVar6 = auVar111._10_2_;
      sVar7 = auVar111._12_2_;
      sVar8 = auVar111._14_2_;
      sVar9 = auVar95._0_2_;
      sVar10 = auVar95._2_2_;
      sVar11 = auVar95._4_2_;
      sVar12 = auVar95._6_2_;
      sVar13 = auVar95._8_2_;
      sVar14 = auVar95._10_2_;
      sVar15 = auVar95._12_2_;
      sVar16 = auVar95._14_2_;
      auVar73._0_2_ = (auVar60._0_2_ + sVar97) - auVar46._0_2_;
      auVar73._2_2_ = (auVar60._2_2_ + sVar99) - auVar31._2_2_;
      auVar73._4_2_ = (auVar60._4_2_ + sVar100) - auVar38._0_2_;
      auVar73._6_2_ = (auVar60._6_2_ + sVar101) - sVar48;
      auVar73._8_2_ = (auVar60._8_2_ + sVar102) - auVar29._8_2_;
      auVar73._10_2_ = (auVar60._10_2_ + sVar103) - auVar25._10_2_;
      auVar73._12_2_ = (auVar60._12_2_ + sVar104) - auVar20._12_2_;
      auVar73._14_2_ = (auVar60._14_2_ + sVar105) - (uVar19 >> 8);
      auVar66 = pabsw(auVar73,auVar73);
      auVar69._0_2_ = (auVar60._0_2_ + sVar97) - sVar59;
      auVar69._2_2_ = (auVar60._2_2_ + sVar99) - sVar62;
      auVar69._4_2_ = (auVar60._4_2_ + sVar100) - sVar59;
      auVar69._6_2_ = (auVar60._6_2_ + sVar101) - sVar62;
      auVar69._8_2_ = (auVar60._8_2_ + sVar102) - sVar59;
      auVar69._10_2_ = (auVar60._10_2_ + sVar103) - sVar62;
      auVar69._12_2_ = (auVar60._12_2_ + sVar104) - sVar59;
      auVar69._14_2_ = (auVar60._14_2_ + sVar105) - sVar62;
      auVar68 = pabsw(auVar68,auVar69);
      local_48 = auVar47._0_2_;
      sStack_46 = auVar47._2_2_;
      sStack_44 = auVar47._4_2_;
      sStack_42 = auVar47._6_2_;
      sStack_40 = auVar47._8_2_;
      sStack_3e = auVar47._10_2_;
      sStack_3c = auVar47._12_2_;
      sStack_3a = auVar47._14_2_;
      auVar96._0_2_ = -(ushort)(auVar66._0_2_ < local_48);
      auVar96._2_2_ = -(ushort)(auVar66._2_2_ < sStack_46);
      auVar96._4_2_ = -(ushort)(auVar66._4_2_ < sStack_44);
      auVar96._6_2_ = -(ushort)(auVar66._6_2_ < sStack_42);
      auVar96._8_2_ = -(ushort)(auVar66._8_2_ < sStack_40);
      auVar96._10_2_ = -(ushort)(auVar66._10_2_ < sStack_3e);
      auVar96._12_2_ = -(ushort)(auVar66._12_2_ < sStack_3c);
      auVar96._14_2_ = -(ushort)(auVar66._14_2_ < sStack_3a);
      auVar70._0_2_ = -(ushort)(auVar68._0_2_ < local_48);
      auVar70._2_2_ = -(ushort)(auVar68._2_2_ < sStack_46);
      auVar70._4_2_ = -(ushort)(auVar68._4_2_ < sStack_44);
      auVar70._6_2_ = -(ushort)(auVar68._6_2_ < sStack_42);
      auVar70._8_2_ = -(ushort)(auVar68._8_2_ < sStack_40);
      auVar70._10_2_ = -(ushort)(auVar68._10_2_ < sStack_3e);
      auVar70._12_2_ = -(ushort)(auVar68._12_2_ < sStack_3c);
      auVar70._14_2_ = -(ushort)(auVar68._14_2_ < sStack_3a);
      auVar67._0_2_ = -(ushort)(auVar68._0_2_ < auVar66._0_2_);
      auVar67._2_2_ = -(ushort)(auVar68._2_2_ < auVar66._2_2_);
      auVar67._4_2_ = -(ushort)(auVar68._4_2_ < auVar66._4_2_);
      auVar67._6_2_ = -(ushort)(auVar68._6_2_ < auVar66._6_2_);
      auVar67._8_2_ = -(ushort)(auVar68._8_2_ < auVar66._8_2_);
      auVar67._10_2_ = -(ushort)(auVar68._10_2_ < auVar66._10_2_);
      auVar67._12_2_ = -(ushort)(auVar68._12_2_ < auVar66._12_2_);
      auVar67._14_2_ = -(ushort)(auVar68._14_2_ < auVar66._14_2_);
      auVar85._0_2_ = auVar49._0_2_ - sVar59;
      auVar85._2_2_ = (ushort)bVar50 - sVar62;
      auVar85._4_2_ = (ushort)bVar51 - sVar59;
      auVar85._6_2_ = (ushort)bVar52 - sVar62;
      auVar85._8_2_ = (ushort)bVar53 - sVar59;
      auVar85._10_2_ = (ushort)bVar54 - sVar62;
      auVar85._12_2_ = (ushort)bVar55 - sVar59;
      auVar85._14_2_ = (ushort)bVar56 - sVar62;
      auVar66 = pabsw(auVar85,auVar85);
      auVar108._0_2_ = (auVar107._0_2_ + auVar49._0_2_) - sVar59;
      auVar108._2_2_ = (auVar107._2_2_ + (ushort)bVar50) - sVar62;
      auVar108._4_2_ = (auVar107._4_2_ + (ushort)bVar51) - sVar59;
      auVar108._6_2_ = (auVar107._6_2_ + (ushort)bVar52) - sVar62;
      auVar108._8_2_ = (auVar107._8_2_ + (ushort)bVar53) - sVar59;
      auVar108._10_2_ = (auVar107._10_2_ + (ushort)bVar54) - sVar62;
      auVar108._12_2_ = (auVar107._12_2_ + (ushort)bVar55) - sVar59;
      auVar108._14_2_ = (auVar107._14_2_ + (ushort)bVar56) - sVar62;
      auVar68 = pabsw(auVar96,auVar108);
      auVar109._0_2_ = -(ushort)(sVar71 < auVar66._0_2_);
      auVar109._2_2_ = -(ushort)(sVar75 < auVar66._2_2_);
      auVar109._4_2_ = -(ushort)(sVar76 < auVar66._4_2_);
      auVar109._6_2_ = -(ushort)(sVar77 < auVar66._6_2_);
      auVar109._8_2_ = -(ushort)(sVar78 < auVar66._8_2_);
      auVar109._10_2_ = -(ushort)(sVar79 < auVar66._10_2_);
      auVar109._12_2_ = -(ushort)(sVar80 < auVar66._12_2_);
      auVar109._14_2_ = -(ushort)(sVar81 < auVar66._14_2_);
      auVar86._0_2_ = -(ushort)(auVar68._0_2_ < auVar66._0_2_);
      auVar86._2_2_ = -(ushort)(auVar68._2_2_ < auVar66._2_2_);
      auVar86._4_2_ = -(ushort)(auVar68._4_2_ < auVar66._4_2_);
      auVar86._6_2_ = -(ushort)(auVar68._6_2_ < auVar66._6_2_);
      auVar86._8_2_ = -(ushort)(auVar68._8_2_ < auVar66._8_2_);
      auVar86._10_2_ = -(ushort)(auVar68._10_2_ < auVar66._10_2_);
      auVar86._12_2_ = -(ushort)(auVar68._12_2_ < auVar66._12_2_);
      auVar86._14_2_ = -(ushort)(auVar68._14_2_ < auVar66._14_2_);
      auVar74._0_2_ = -(ushort)(auVar68._0_2_ < sVar71);
      auVar74._2_2_ = -(ushort)(auVar68._2_2_ < sVar75);
      auVar74._4_2_ = -(ushort)(auVar68._4_2_ < sVar76);
      auVar74._6_2_ = -(ushort)(auVar68._6_2_ < sVar77);
      auVar74._8_2_ = -(ushort)(auVar68._8_2_ < sVar78);
      auVar74._10_2_ = -(ushort)(auVar68._10_2_ < sVar79);
      auVar74._12_2_ = -(ushort)(auVar68._12_2_ < sVar80);
      auVar74._14_2_ = -(ushort)(auVar68._14_2_ < sVar81);
      auVar66 = ~(auVar70 | auVar96) & auVar98 |
                (~auVar67 & auVar46 | auVar61 & auVar67) & (auVar70 | auVar96);
      auVar68 = ~(auVar86 | auVar109) & auVar98 |
                (~auVar74 & auVar49 | auVar61 & auVar74) & (auVar86 | auVar109);
      sVar71 = auVar66._0_2_;
      sVar75 = auVar66._2_2_;
      sVar76 = auVar66._4_2_;
      sVar77 = auVar66._6_2_;
      sVar78 = auVar66._8_2_;
      sVar79 = auVar66._10_2_;
      sVar80 = auVar66._12_2_;
      sVar81 = auVar66._14_2_;
      sVar97 = auVar68._0_2_;
      sVar99 = auVar68._2_2_;
      sVar100 = auVar68._4_2_;
      sVar101 = auVar68._6_2_;
      sVar102 = auVar68._8_2_;
      sVar103 = auVar68._10_2_;
      sVar104 = auVar68._12_2_;
      sVar105 = auVar68._14_2_;
      *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar111[0] - (0xff < sVar1);
      dst[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar111[2] - (0xff < sVar2);
      dst[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar111[4] - (0xff < sVar3);
      dst[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar111[6] - (0xff < sVar4);
      dst[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar111[8] - (0xff < sVar5);
      dst[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar111[10] - (0xff < sVar6);
      dst[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar111[0xc] - (0xff < sVar7);
      dst[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar111[0xe] - (0xff < sVar8);
      dst[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar95[0] - (0xff < sVar9);
      dst[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar95[2] - (0xff < sVar10);
      dst[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar95[4] - (0xff < sVar11);
      dst[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar95[6] - (0xff < sVar12);
      dst[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar95[8] - (0xff < sVar13);
      dst[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar95[10] - (0xff < sVar14);
      dst[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar95[0xc] - (0xff < sVar15);
      dst[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar95[0xe] - (0xff < sVar16);
      dst[0x10] = (0 < sVar71) * (sVar71 < 0x100) * auVar66[0] - (0xff < sVar71);
      dst[0x11] = (0 < sVar75) * (sVar75 < 0x100) * auVar66[2] - (0xff < sVar75);
      dst[0x12] = (0 < sVar76) * (sVar76 < 0x100) * auVar66[4] - (0xff < sVar76);
      dst[0x13] = (0 < sVar77) * (sVar77 < 0x100) * auVar66[6] - (0xff < sVar77);
      dst[0x14] = (0 < sVar78) * (sVar78 < 0x100) * auVar66[8] - (0xff < sVar78);
      dst[0x15] = (0 < sVar79) * (sVar79 < 0x100) * auVar66[10] - (0xff < sVar79);
      dst[0x16] = (0 < sVar80) * (sVar80 < 0x100) * auVar66[0xc] - (0xff < sVar80);
      dst[0x17] = (0 < sVar81) * (sVar81 < 0x100) * auVar66[0xe] - (0xff < sVar81);
      dst[0x18] = (0 < sVar97) * (sVar97 < 0x100) * auVar68[0] - (0xff < sVar97);
      dst[0x19] = (0 < sVar99) * (sVar99 < 0x100) * auVar68[2] - (0xff < sVar99);
      dst[0x1a] = (0 < sVar100) * (sVar100 < 0x100) * auVar68[4] - (0xff < sVar100);
      dst[0x1b] = (0 < sVar101) * (sVar101 < 0x100) * auVar68[6] - (0xff < sVar101);
      dst[0x1c] = (0 < sVar102) * (sVar102 < 0x100) * auVar68[8] - (0xff < sVar102);
      dst[0x1d] = (0 < sVar103) * (sVar103 < 0x100) * auVar68[10] - (0xff < sVar103);
      dst[0x1e] = (0 < sVar104) * (sVar104 < 0x100) * auVar68[0xc] - (0xff < sVar104);
      dst[0x1f] = (0 < sVar105) * (sVar105 < 0x100) * auVar68[0xe] - (0xff < sVar105);
      dst = dst + stride;
      auVar98._0_2_ = auVar106._0_2_ + 1;
      auVar98._2_2_ = auVar106._2_2_ + 1;
      auVar98._4_2_ = auVar106._4_2_ + 1;
      auVar98._6_2_ = auVar106._6_2_ + 1;
      auVar98._8_2_ = auVar106._8_2_ + 1;
      auVar98._10_2_ = auVar106._10_2_ + 1;
      auVar98._12_2_ = auVar106._12_2_ + 1;
      auVar98._14_2_ = auVar106._14_2_ + 1;
      iVar45 = iVar45 + -1;
      auVar106 = auVar98;
    } while (iVar45 != 0);
    lVar44 = lVar44 + 1;
  } while (lVar44 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

      _mm_store_si128((__m128i *)dst, r32l);
      _mm_store_si128((__m128i *)(dst + 16), r32h);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}